

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O0

string * __thiscall
cmList::Join<std::_Rb_tree_const_iterator<std::__cxx11::string>>
          (string *__return_storage_ptr__,cmList *this,
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,string_view glue)

{
  bool bVar1;
  reference pbVar2;
  string *psVar3;
  _Self local_70;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  allocator<char> local_51;
  string local_50 [8];
  string sep;
  string_view glue_local;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  string *joined;
  
  glue_local._M_len = glue._M_len;
  sep.field_2._8_8_ = last._M_node;
  glue_local._M_str = (char *)first._M_node;
  last_local._M_node = (_Base_ptr)this;
  bVar1 = std::operator==(&last_local,(_Self *)&glue_local._M_str);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_50,(basic_string_view<char,_std::char_traits<char>_> *)((long)&sep.field_2 + 8)
               ,&local_51);
    std::allocator<char>::~allocator(&local_51);
    it._M_node._3_1_ = 0;
    pbVar2 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&last_local);
    psVar3 = ToString(pbVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
    local_70._M_node =
         (_Base_ptr)std::next<std::_Rb_tree_const_iterator<std::__cxx11::string>>(last_local,1);
    while (bVar1 = std::operator!=(&local_70,(_Self *)&glue_local._M_str), bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_50);
      pbVar2 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_70);
      psVar3 = ToString(pbVar2);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_70);
    }
    it._M_node._3_1_ = 1;
    std::__cxx11::string::~string(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Join(InputIterator first, InputIterator last,
                          cm::string_view glue)
  {
    if (first == last) {
      return std::string{};
    }

    const auto sep = std::string{ glue };

    std::string joined = cmList::ToString(*first);
    for (auto it = std::next(first); it != last; ++it) {
      joined += sep;
      joined += cmList::ToString(*it);
    }

    return joined;
  }